

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

MOJOSHADER_parseData * copyparsedata(MOJOSHADER_parseData *src,MOJOSHADER_malloc m,void *d)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  MOJOSHADER_free p_Var4;
  undefined8 uVar5;
  MOJOSHADER_shaderType MVar6;
  int iVar7;
  MOJOSHADER_parseData *__s;
  MOJOSHADER_error *pMVar8;
  size_t sVar9;
  char *pcVar10;
  MOJOSHADER_uniform *pMVar11;
  MOJOSHADER_constant *__dest;
  MOJOSHADER_sampler *pMVar12;
  MOJOSHADER_attribute *pMVar13;
  MOJOSHADER_swizzle *__dest_00;
  MOJOSHADER_symbol *__s_00;
  MOJOSHADER_preshader *pMVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  
  __s = (MOJOSHADER_parseData *)(*m)(0xd0,d);
  lVar16 = 0;
  memset(__s,0,0xd0);
  p_Var4 = src->free;
  __s->malloc = src->malloc;
  __s->free = p_Var4;
  __s->malloc_data = src->malloc_data;
  uVar17 = src->error_count * 0x18;
  __s->error_count = src->error_count;
  pMVar8 = (MOJOSHADER_error *)(*m)(uVar17,d);
  __s->errors = pMVar8;
  memset(pMVar8,0,(ulong)uVar17);
  for (lVar15 = 0; lVar15 < __s->error_count; lVar15 = lVar15 + 1) {
    sVar9 = strlen(*(char **)((long)&src->errors->error + lVar16));
    pcVar10 = (char *)(*m)((int)sVar9 + 1,d);
    strcpy(pcVar10,*(char **)((long)&src->errors->error + lVar16));
    *(char **)((long)&__s->errors->error + lVar16) = pcVar10;
    sVar9 = strlen(*(char **)((long)&src->errors->filename + lVar16));
    pcVar10 = (char *)(*m)((int)sVar9 + 1,d);
    strcpy(pcVar10,*(char **)((long)&src->errors->filename + lVar16));
    pMVar8 = __s->errors;
    *(char **)((long)&pMVar8->filename + lVar16) = pcVar10;
    *(undefined4 *)((long)&pMVar8->error_position + lVar16) =
         *(undefined4 *)((long)&src->errors->error_position + lVar16);
    lVar16 = lVar16 + 0x18;
  }
  __s->profile = src->profile;
  iVar3 = src->output_len;
  __s->output_len = iVar3;
  pcVar10 = (char *)(*m)(iVar3,d);
  memcpy(pcVar10,src->output,(long)src->output_len);
  __s->output = pcVar10;
  MVar6 = src->shader_type;
  iVar3 = src->major_ver;
  iVar7 = src->minor_ver;
  __s->instruction_count = src->instruction_count;
  __s->shader_type = MVar6;
  __s->major_ver = iVar3;
  __s->minor_ver = iVar7;
  uVar17 = src->uniform_count * 0x18;
  __s->uniform_count = src->uniform_count;
  pMVar11 = (MOJOSHADER_uniform *)(*m)(uVar17,d);
  __s->uniforms = pMVar11;
  lVar15 = 0;
  memset(pMVar11,0,(ulong)uVar17);
  for (lVar16 = 0; lVar16 < __s->uniform_count; lVar16 = lVar16 + 1) {
    pMVar11 = src->uniforms;
    puVar1 = (undefined8 *)((long)&pMVar11->type + lVar15);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)&__s->uniforms->type + lVar15);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    sVar9 = strlen(*(char **)((long)&pMVar11->name + lVar15));
    pcVar10 = (char *)(*m)((int)sVar9 + 1,d);
    strcpy(pcVar10,*(char **)((long)&src->uniforms->name + lVar15));
    *(char **)((long)&__s->uniforms->name + lVar15) = pcVar10;
    lVar15 = lVar15 + 0x18;
  }
  uVar17 = src->constant_count * 0x18;
  __s->constant_count = src->constant_count;
  __dest = (MOJOSHADER_constant *)(*m)(uVar17,d);
  __s->constants = __dest;
  memcpy(__dest,src->constants,(ulong)uVar17);
  uVar17 = src->sampler_count * 0x18;
  __s->sampler_count = src->sampler_count;
  pMVar12 = (MOJOSHADER_sampler *)(*m)(uVar17,d);
  __s->samplers = pMVar12;
  lVar15 = 0;
  memset(pMVar12,0,(ulong)uVar17);
  for (lVar16 = 0; lVar16 < __s->sampler_count; lVar16 = lVar16 + 1) {
    pMVar12 = src->samplers;
    *(undefined8 *)((long)&__s->samplers->type + lVar15) =
         *(undefined8 *)((long)&pMVar12->type + lVar15);
    sVar9 = strlen(*(char **)((long)&pMVar12->name + lVar15));
    pcVar10 = (char *)(*m)((int)sVar9 + 1,d);
    strcpy(pcVar10,*(char **)((long)&src->samplers->name + lVar15));
    pMVar12 = __s->samplers;
    *(char **)((long)&pMVar12->name + lVar15) = pcVar10;
    *(undefined4 *)((long)&pMVar12->texbem + lVar15) =
         *(undefined4 *)((long)&src->samplers->texbem + lVar15);
    lVar15 = lVar15 + 0x18;
  }
  iVar3 = src->attribute_count;
  __s->attribute_count = iVar3;
  uVar17 = iVar3 << 4;
  pMVar13 = (MOJOSHADER_attribute *)(*m)(uVar17,d);
  __s->attributes = pMVar13;
  lVar15 = 0;
  memset(pMVar13,0,(ulong)uVar17);
  for (lVar16 = 0; lVar16 < __s->attribute_count; lVar16 = lVar16 + 1) {
    pMVar13 = src->attributes;
    *(undefined8 *)((long)&__s->attributes->usage + lVar15) =
         *(undefined8 *)((long)&pMVar13->usage + lVar15);
    sVar9 = strlen(*(char **)((long)&pMVar13->name + lVar15));
    pcVar10 = (char *)(*m)((int)sVar9 + 1,d);
    strcpy(pcVar10,*(char **)((long)&src->attributes->name + lVar15));
    *(char **)((long)&__s->attributes->name + lVar15) = pcVar10;
    lVar15 = lVar15 + 0x10;
  }
  iVar3 = src->output_count;
  __s->output_count = iVar3;
  uVar17 = iVar3 << 4;
  pMVar13 = (MOJOSHADER_attribute *)(*m)(uVar17,d);
  __s->outputs = pMVar13;
  lVar15 = 0;
  memset(pMVar13,0,(ulong)uVar17);
  for (lVar16 = 0; lVar16 < __s->output_count; lVar16 = lVar16 + 1) {
    pMVar13 = src->outputs;
    *(undefined8 *)((long)&__s->outputs->usage + lVar15) =
         *(undefined8 *)((long)&pMVar13->usage + lVar15);
    sVar9 = strlen(*(char **)((long)&pMVar13->name + lVar15));
    pcVar10 = (char *)(*m)((int)sVar9 + 1,d);
    strcpy(pcVar10,*(char **)((long)&src->outputs->name + lVar15));
    *(char **)((long)&__s->outputs->name + lVar15) = pcVar10;
    lVar15 = lVar15 + 0x10;
  }
  uVar17 = src->swizzle_count * 0xc;
  __s->swizzle_count = src->swizzle_count;
  __dest_00 = (MOJOSHADER_swizzle *)(*m)(uVar17,d);
  __s->swizzles = __dest_00;
  memcpy(__dest_00,src->swizzles,(ulong)uVar17);
  uVar17 = src->symbol_count * 0x38;
  __s->symbol_count = src->symbol_count;
  __s_00 = (MOJOSHADER_symbol *)(*m)(uVar17,d);
  __s->symbols = __s_00;
  lVar15 = 0;
  memset(__s_00,0,(ulong)uVar17);
  for (lVar16 = 0; lVar16 < __s->symbol_count; lVar16 = lVar16 + 1) {
    copysymbol((MOJOSHADER_symbol *)((long)&__s->symbols->name + lVar15),
               (MOJOSHADER_symbol *)((long)&src->symbols->name + lVar15),m,d);
    lVar15 = lVar15 + 0x38;
  }
  if (src->preshader != (MOJOSHADER_preshader *)0x0) {
    pMVar14 = copypreshader(src->preshader,m,d);
    __s->preshader = pMVar14;
  }
  return __s;
}

Assistant:

MOJOSHADER_parseData *copyparsedata(const MOJOSHADER_parseData *src,
                                    MOJOSHADER_malloc m,
                                    void *d)
{
    int i;
    uint32 siz;
    char *stringcopy;
    MOJOSHADER_parseData *retval;

    retval = (MOJOSHADER_parseData *) m(sizeof (MOJOSHADER_parseData), d);
    memset(retval, '\0', sizeof (MOJOSHADER_parseData));

    /* Copy malloc/free */
    retval->malloc = src->malloc;
    retval->free = src->free;
    retval->malloc_data = src->malloc_data;

    // !!! FIXME: Out of memory check!
    #define COPY_STRING(location) \
        siz = strlen(src->location) + 1; \
        stringcopy = (char *) m(siz, d); \
        strcpy(stringcopy, src->location); \
        retval->location = stringcopy; \

    /* Copy errors */
    siz = sizeof (MOJOSHADER_error) * src->error_count;
    retval->error_count = src->error_count;
    retval->errors = (MOJOSHADER_error *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->errors, '\0', siz);
    for (i = 0; i < retval->error_count; i++)
    {
        COPY_STRING(errors[i].error)
        COPY_STRING(errors[i].filename)
        retval->errors[i].error_position = src->errors[i].error_position;
    } // for

    /* Copy profile string constant */
    retval->profile = src->profile;

    /* Copy shader output */
    retval->output_len = src->output_len;
    stringcopy = (char *) m(src->output_len, d);
    memcpy(stringcopy, src->output, src->output_len);
    retval->output = stringcopy;

    /* Copy miscellaneous shader info */
    retval->instruction_count = src->instruction_count;
    retval->shader_type = src->shader_type;
    retval->major_ver = src->major_ver;
    retval->minor_ver = src->minor_ver;

    /* Copy uniforms */
    siz = sizeof (MOJOSHADER_uniform) * src->uniform_count;
    retval->uniform_count = src->uniform_count;
    retval->uniforms = (MOJOSHADER_uniform *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->uniforms, '\0', siz);
    for (i = 0; i < retval->uniform_count; i++)
    {
        retval->uniforms[i].type = src->uniforms[i].type;
        retval->uniforms[i].index = src->uniforms[i].index;
        retval->uniforms[i].array_count = src->uniforms[i].array_count;
        retval->uniforms[i].constant = src->uniforms[i].constant;
        COPY_STRING(uniforms[i].name)
    } // for

    /* Copy constants */
    siz = sizeof (MOJOSHADER_constant) * src->constant_count;
    retval->constant_count = src->constant_count;
    retval->constants = (MOJOSHADER_constant *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->constants, src->constants, siz);

    /* Copy samplers */
    siz = sizeof (MOJOSHADER_sampler) * src->sampler_count;
    retval->sampler_count = src->sampler_count;
    retval->samplers = (MOJOSHADER_sampler *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->samplers, '\0', siz);
    for (i = 0; i < retval->sampler_count; i++)
    {
        retval->samplers[i].type = src->samplers[i].type;
        retval->samplers[i].index = src->samplers[i].index;
        COPY_STRING(samplers[i].name)
        retval->samplers[i].texbem = src->samplers[i].texbem;
    } // for

    /* Copy attributes */
    siz = sizeof (MOJOSHADER_attribute) * src->attribute_count;
    retval->attribute_count = src->attribute_count;
    retval->attributes = (MOJOSHADER_attribute *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->attributes, '\0', siz);
    for (i = 0; i < retval->attribute_count; i++)
    {
        retval->attributes[i].usage = src->attributes[i].usage;
        retval->attributes[i].index = src->attributes[i].index;
        COPY_STRING(attributes[i].name)
    } // for

    /* Copy outputs */
    siz = sizeof (MOJOSHADER_attribute) * src->output_count;
    retval->output_count = src->output_count;
    retval->outputs = (MOJOSHADER_attribute *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->outputs, '\0', siz);
    for (i = 0; i < retval->output_count; i++)
    {
        retval->outputs[i].usage = src->outputs[i].usage;
        retval->outputs[i].index = src->outputs[i].index;
        COPY_STRING(outputs[i].name)
    } // for

    #undef COPY_STRING

    /* Copy swizzles */
    siz = sizeof (MOJOSHADER_swizzle) * src->swizzle_count;
    retval->swizzle_count = src->swizzle_count;
    retval->swizzles = (MOJOSHADER_swizzle *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->swizzles, src->swizzles, siz);

    /* Copy symbols */
    siz = sizeof (MOJOSHADER_symbol) * src->symbol_count;
    retval->symbol_count = src->symbol_count;
    retval->symbols = (MOJOSHADER_symbol *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->symbols, '\0', siz);
    for (i = 0; i < retval->symbol_count; i++)
        copysymbol(&retval->symbols[i], &src->symbols[i], m, d);

    /* Copy preshader */
    if (src->preshader != NULL)
        retval->preshader = copypreshader(src->preshader, m, d);

    return retval;
}